

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAmbientLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::AmbientLight> *this_00;
  XML *in_RDX;
  Node *in_RDI;
  Vec3fa VVar1;
  Vec3fa L;
  Vec3fa *in_stack_fffffffffffffef8;
  AmbientLight *in_stack_ffffffffffffff00;
  AmbientLight *in_stack_ffffffffffffff08;
  Ref<embree::XML> *in_stack_ffffffffffffff78;
  XMLLoader *in_stack_ffffffffffffff80;
  long *local_60;
  string *in_stack_ffffffffffffffb8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff80,"L",(allocator *)&stack0xffffffffffffff7f);
  XML::child(in_RDX,in_stack_ffffffffffffffb8);
  VVar1 = load<embree::Vec3fa>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 0x18))(VVar1.field_0._0_8_,VVar1.field_0._8_8_);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  this_00 = (LightNodeImpl<embree::SceneGraph::AmbientLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::operator_new(0x3ac052);
  SceneGraph::AmbientLight::AmbientLight(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::LightNodeImpl
            (this_00,in_stack_ffffffffffffff08);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAmbientLight(const Ref<XML>& xml) 
  {
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    return new SceneGraph::LightNodeImpl<SceneGraph::AmbientLight>(SceneGraph::AmbientLight(L));
  }